

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall
pstore::storage::
copy<pstore::storage::copy_from_store_traits,pstore::database::get_spanningu(pstore::address,unsigned_long,bool)const::__0>
          (storage *this,value_type addr,temp_pointer size,uint8_t *p)

{
  in_store_pointer puVar1;
  bool bVar2;
  unsigned_short uVar3;
  offset_type oVar4;
  type paVar5;
  element_type *peVar6;
  element_type *peVar7;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  in_store_pointer puVar9;
  uint64_t uVar10;
  unsigned_long *puVar11;
  memory_mapper_ptr *pmVar12;
  reference pvVar13;
  uint64_t local_80;
  temp_pointer local_78;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_70;
  memory_mapper_ptr *region;
  uint64_t inc;
  unsigned_long local_58;
  uint64_t copy_size;
  in_store_pointer region_base;
  in_store_pointer in_store_ptr;
  sat_entry *segment_pointer;
  uint8_t *puStack_30;
  segment_type segment;
  temp_pointer p_local;
  size_t size_local;
  storage *this_local;
  address local_10;
  address addr_local;
  
  puStack_30 = p;
  p_local = size;
  size_local = (size_t)this;
  local_10.a_ = addr;
  segment_pointer._6_2_ = address::segment(&local_10);
  paVar5 = std::
           unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ::operator*(&this->sat_);
  in_store_ptr = (in_store_pointer)
                 std::array<pstore::sat_entry,_65536UL>::operator[]
                           (paVar5,(ulong)segment_pointer._6_2_);
  bVar2 = std::operator!=((shared_ptr<void> *)in_store_ptr,(nullptr_t)0x0);
  if (((!bVar2) ||
      (bVar2 = std::operator!=((shared_ptr<pstore::memory_mapper_base> *)(in_store_ptr + 0x10),
                               (nullptr_t)0x0), !bVar2)) ||
     (bVar2 = sat_entry::is_valid((sat_entry *)in_store_ptr), !bVar2)) {
    assert_failed("segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x140);
  }
  peVar6 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)in_store_ptr);
  oVar4 = address::offset(&local_10);
  region_base = (in_store_pointer)((long)peVar6 + (ulong)oVar4);
  peVar7 = std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_store_ptr + 0x10));
  p_Var8 = &memory_mapper_base::data(peVar7)->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
  puVar9 = (in_store_pointer)std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
  puVar1 = region_base;
  copy_size = (uint64_t)puVar9;
  if (puVar9 <= region_base) {
    peVar7 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_store_ptr + 0x10));
    uVar10 = memory_mapper_base::size(peVar7);
    if (puVar1 <= puVar9 + uVar10) {
      peVar7 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_store_ptr + 0x10));
      uVar10 = memory_mapper_base::size(peVar7);
      local_58 = uVar10 - ((long)region_base - copy_size);
      inc = (uint64_t)p_local;
      puVar11 = std::min<unsigned_long>(&local_58,&inc);
      local_58 = *puVar11;
      database::get_spanningu::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&this_local + 7),region_base,puStack_30,local_58)
      ;
      puStack_30 = puStack_30 + local_58;
      p_local = p_local + -local_58;
      while( true ) {
        if (p_local == (temp_pointer)0x0) {
          return;
        }
        pmVar12 = (memory_mapper_ptr *)(local_58 + 0x3fffff >> 0x16);
        region = pmVar12;
        uVar3 = std::numeric_limits<unsigned_short>::max();
        if ((memory_mapper_ptr *)(ulong)uVar3 <= pmVar12) {
          assert_failed("inc < std::numeric_limits<address::segment_type>::max ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                        ,0x15c);
        }
        if (0xffff < (long)&(region->
                            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + (ulong)segment_pointer._6_2_) {
          assert_failed("segment + inc < sat_elements",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                        ,0x15d);
        }
        segment_pointer._6_2_ = segment_pointer._6_2_ + (short)region;
        paVar5 = std::
                 unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 ::operator*(&this->sat_);
        pvVar13 = std::array<pstore::sat_entry,_65536UL>::operator[]
                            (paVar5,(ulong)segment_pointer._6_2_);
        local_70 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&pvVar13->region;
        bVar2 = std::operator!=((shared_ptr<pstore::memory_mapper_base> *)local_70,(nullptr_t)0x0);
        if (!bVar2) break;
        local_78 = p_local;
        peVar7 = std::
                 __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_70);
        local_80 = memory_mapper_base::size(peVar7);
        puVar11 = std::min<unsigned_long>((unsigned_long *)&local_78,&local_80);
        local_58 = *puVar11;
        peVar7 = std::
                 __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_70);
        p_Var8 = &memory_mapper_base::data(peVar7)->
                  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
        region_base = (in_store_pointer)
                      std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
        database::get_spanningu::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&this_local + 7),region_base,puStack_30,
                   local_58);
        puStack_30 = puStack_30 + local_58;
        p_local = p_local + -local_58;
      }
      assert_failed("region != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                    ,0x161);
    }
  }
  assert_failed("in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,0x148);
}

Assistant:

void storage::copy (address const addr, std::size_t size, typename Traits::temp_pointer p,
                        Function copier) const {

        PSTORE_STATIC_ASSERT (std::numeric_limits<std::size_t>::max () <=
                              std::numeric_limits<std::uint64_t>::max ());
        address::segment_type segment = addr.segment ();
        PSTORE_STATIC_ASSERT (std::numeric_limits<decltype (segment)>::max () <= sat_elements);
        sat_entry const & segment_pointer = (*sat_)[segment];
        PSTORE_ASSERT (segment_pointer.value != nullptr && segment_pointer.region != nullptr &&
                       segment_pointer.is_valid ());

        auto in_store_ptr =
            static_cast<typename Traits::in_store_pointer> (segment_pointer.value.get ()) +
            addr.offset ();
        auto region_base =
            static_cast<typename Traits::in_store_pointer> (segment_pointer.region->data ().get ());
        PSTORE_ASSERT (in_store_ptr >= region_base &&
                       in_store_ptr <= region_base + segment_pointer.region->size ());

        std::uint64_t copy_size = segment_pointer.region->size () -
                                  static_cast<std::uintptr_t> (in_store_ptr - region_base);
        static_assert (std::numeric_limits<std::size_t>::max () <=
                           std::numeric_limits<std::uint64_t>::max (),
                       "size_t must not be larger than uint64!");
        copy_size = std::min (copy_size, std::uint64_t{size});

        // An initial copy for the tail of the first of the regions covered by the addr..addr+size
        // range.
        copier (in_store_ptr, p, copy_size);

        // Now copy the subsequent region(s).
        for (p += copy_size, size -= copy_size; size > 0; p += copy_size, size -= copy_size) {

            // We copied all of the necessary data to the previous region. Now move to the next
            // region and do the same.
            std::uint64_t const inc =
                (copy_size + address::segment_size - 1) / address::segment_size;
            PSTORE_ASSERT (inc < std::numeric_limits<address::segment_type>::max ());
            PSTORE_ASSERT (segment + inc < sat_elements);
            segment += static_cast<address::segment_type> (inc);

            region::memory_mapper_ptr const & region = (*sat_)[segment].region;
            PSTORE_ASSERT (region != nullptr);

            copy_size = std::min (static_cast<std::uint64_t> (size), region->size ());
            in_store_ptr = static_cast<typename Traits::in_store_pointer> (region->data ().get ());
            copier (in_store_ptr, p, copy_size);
        }
    }